

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

void __thiscall
andres::Marray<int,std::allocator<unsigned_long>>::
Marray<andres::BinaryViewExpression<andres::View<int,true,std::allocator<unsigned_long>>,int,andres::View<int,true,std::allocator<unsigned_long>>,int,andres::marray_detail::Times<int,int,int>>,int>
          (Marray<int,std::allocator<unsigned_long>> *this,
          ViewExpression<andres::BinaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int>
          *expression,allocator_type *allocator)

{
  value_type vVar1;
  int *piVar2;
  size_t sVar3;
  size_t *begin;
  size_t *end;
  CoordinateOrder *pCVar4;
  CoordinateOrder *internalCoordinateOrder;
  ulong uVar5;
  ulong uVar6;
  allocator_type local_61;
  Geometry<std::allocator<unsigned_long>_> local_60;
  
  View<int,_false,_std::allocator<unsigned_long>_>::View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)this,(allocator_type *)&local_60);
  uVar6 = *(ulong *)(*(long *)(expression + 8) + 0x30);
  if (*(ulong *)(*(long *)(expression + 8) + 0x30) < *(ulong *)(*(long *)expression + 0x30)) {
    uVar6 = *(ulong *)(*(long *)expression + 0x30);
  }
  piVar2 = __gnu_cxx::new_allocator<int>::allocate
                     ((new_allocator<int> *)(this + 0x40),uVar6,(void *)0x0);
  *(int **)this = piVar2;
  sVar3 = BinaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
          ::dimension((BinaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
                       *)expression);
  if (sVar3 == 0) {
    pCVar4 = BinaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
             ::coordinateOrder((BinaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
                                *)expression);
    marray_detail::Geometry<std::allocator<unsigned_long>_>::Geometry
              (&local_60,0,pCVar4,1,true,&local_61);
    marray_detail::Geometry<std::allocator<unsigned_long>_>::operator=
              ((Geometry<std::allocator<unsigned_long>_> *)(this + 8),&local_60);
  }
  else {
    begin = BinaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
            ::shapeBegin((BinaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
                          *)expression);
    end = BinaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
          ::shapeEnd((BinaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
                      *)expression);
    pCVar4 = BinaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
             ::coordinateOrder((BinaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
                                *)expression);
    internalCoordinateOrder =
         BinaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
         ::coordinateOrder((BinaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
                            *)expression);
    marray_detail::Geometry<std::allocator<unsigned_long>>::Geometry<unsigned_long_const*>
              ((Geometry<std::allocator<unsigned_long>> *)&local_60,begin,end,pCVar4,
               internalCoordinateOrder,&local_61);
    marray_detail::Geometry<std::allocator<unsigned_long>_>::operator=
              ((Geometry<std::allocator<unsigned_long>_> *)(this + 8),&local_60);
  }
  marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&local_60);
  sVar3 = BinaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
          ::dimension((BinaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
                       *)expression);
  uVar6 = *(ulong *)(*(long *)expression + 0x30);
  uVar5 = *(ulong *)(*(long *)(expression + 8) + 0x30);
  if (sVar3 == 0) {
    if (uVar5 < uVar6) {
      uVar5 = uVar6;
    }
    marray_detail::Assert<bool>(uVar5 < 2);
    vVar1 = BinaryViewExpression<andres::View<int,true,std::allocator<unsigned_long>>,int,andres::View<int,true,std::allocator<unsigned_long>>,int,andres::marray_detail::Times<int,int,int>>
            ::operator()((BinaryViewExpression<andres::View<int,true,std::allocator<unsigned_long>>,int,andres::View<int,true,std::allocator<unsigned_long>>,int,andres::marray_detail::Times<int,int,int>>
                          *)expression,0);
    **(value_type **)this = vVar1;
  }
  else {
    marray_detail::Assert<bool>(uVar5 != 0 || uVar6 != 0);
    marray_detail::
    operate<andres::marray_detail::Assign<int,int>,int,std::allocator<unsigned_long>,andres::BinaryViewExpression<andres::View<int,true,std::allocator<unsigned_long>>,int,andres::View<int,true,std::allocator<unsigned_long>>,int,andres::marray_detail::Times<int,int,int>>,int>
              (this,expression);
  }
  Marray<int,_std::allocator<unsigned_long>_>::testInvariant
            ((Marray<int,_std::allocator<unsigned_long>_> *)this);
  return;
}

Assistant:

inline
Marray<T, A>::Marray
(
    const ViewExpression<E, Te>& expression,
    const allocator_type& allocator
) 
:   dataAllocator_(allocator)
{
    this->data_ = dataAllocator_.allocate(expression.size());
    if(expression.dimension() == 0) {
        this->geometry_ = geometry_type(0, 
            static_cast<const E&>(expression).coordinateOrder(), 
            1, true, dataAllocator_);
    }
    else {
        this->geometry_ = geometry_type(
            static_cast<const E&>(expression).shapeBegin(), 
            static_cast<const E&>(expression).shapeEnd(),
            static_cast<const E&>(expression).coordinateOrder(),
            static_cast<const E&>(expression).coordinateOrder(),
            dataAllocator_);

    }
    const E& e = static_cast<const E&>(expression);
    if(e.dimension() == 0) {
        marray_detail::Assert(MARRAY_NO_ARG_TEST || e.size() < 2);
        this->data_[0] = static_cast<T>(e(0));
    }
    else {
        marray_detail::Assert(MARRAY_NO_ARG_TEST || e.size() != 0);
        marray_detail::operate(*this, e, marray_detail::Assign<T, Te>());
    }
    testInvariant();
}